

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void saveToFile(string *str,string *filename)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ofstream out;
  
  std::operator+(&local_230,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/",
                 filename);
  std::ofstream::ofstream(&out,(string *)&local_230,_S_out);
  std::__cxx11::string::~string((string *)&local_230);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::operator<<((ostream *)&out,(string *)str);
    std::ofstream::~ofstream(&out);
    return;
  }
  __assert_fail("out.is_open()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/main.cpp"
                ,0x111,"void saveToFile(const std::string &, const std::string &)");
}

Assistant:

void saveToFile(const std::string& str, const std::string& filename){
    std::ofstream out(SRC"/" +filename);
    assert(out.is_open());
    out << str;
}